

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* chaiscript::eval::Arg_List_AST_Node::get_arg_names_abi_cxx11_(AST_NodePtr *t_node)

{
  bool bVar1;
  element_type *peVar2;
  value_type *in_RDI;
  shared_ptr<chaiscript::AST_Node> *node;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *retval;
  value_type *this;
  AST_NodePtr *in_stack_ffffffffffffff98;
  string local_58 [32];
  reference local_38;
  shared_ptr<chaiscript::AST_Node> *local_30;
  __normal_iterator<std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
  local_28;
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x238b74);
  peVar2 = std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x238b7e);
  local_20 = &peVar2->children;
  local_28._M_current =
       (shared_ptr<chaiscript::AST_Node> *)
       std::
       vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
       ::begin((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                *)in_RDI);
  local_30 = (shared_ptr<chaiscript::AST_Node> *)
             std::
             vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
             ::end((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                    *)in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
                             *)this,(__normal_iterator<std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
                                     *)in_RDI), bVar1) {
    local_38 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
               ::operator*(&local_28);
    get_arg_name_abi_cxx11_(in_stack_ffffffffffffff98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,in_RDI);
    std::__cxx11::string::~string(local_58);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<chaiscript::AST_Node>_*,_std::vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>_>
    ::operator++(&local_28);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this;
}

Assistant:

static std::vector<std::string> get_arg_names(const AST_NodePtr &t_node) {
          std::vector<std::string> retval;

          for (const auto &node : t_node->children)
          {
            retval.push_back(get_arg_name(node));
          }

          return retval;
        }